

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O0

void __thiscall FString::ReplaceChars(FString *this,char oldchar,char newchar)

{
  size_t sVar1;
  size_t j;
  size_t i;
  char newchar_local;
  char oldchar_local;
  FString *this_local;
  
  LockBuffer(this);
  j = 0;
  sVar1 = Len(this);
  for (; j < sVar1; j = j + 1) {
    if (this->Chars[j] == oldchar) {
      this->Chars[j] = newchar;
    }
  }
  UnlockBuffer(this);
  return;
}

Assistant:

void FString::ReplaceChars (char oldchar, char newchar)
{
	size_t i, j;

	LockBuffer();
	for (i = 0, j = Len(); i < j; ++i)
	{
		if (Chars[i] == oldchar)
		{
			Chars[i] = newchar;
		}
	}
	UnlockBuffer();
}